

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::TSMuxer(TSMuxer *this,MuxerManager *owner)

{
  value_type_conflict2 local_3c;
  value_type_conflict4 local_38 [4];
  MuxerManager *local_18;
  MuxerManager *owner_local;
  TSMuxer *this_local;
  
  local_18 = owner;
  owner_local = (MuxerManager *)this;
  AbstractMuxer::AbstractMuxer(&this->super_AbstractMuxer,owner);
  (this->super_AbstractMuxer)._vptr_AbstractMuxer = (_func_int **)&PTR__TSMuxer_00442638;
  std::vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>::
  vector(&this->m_m2tsDelayBlocks);
  std::vector<long,_std::allocator<long>_>::vector(&this->m_lastPts);
  std::vector<long,_std::allocator<long>_>::vector(&this->m_firstPts);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (&this->m_extIndexToTSIndex);
  std::
  map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  ::map(&this->m_streamInfo);
  TS_program_map_section::TS_program_map_section(&this->m_pmt);
  TS_program_association_section::TS_program_association_section(&this->m_pat);
  std::
  map<int,_unsigned_char,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>::
  map(&this->m_pesType);
  MemoryBlock::MemoryBlock(&this->m_pesData);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_muxedPacketCnt);
  std::__cxx11::string::string((string *)&this->m_outFileName);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->m_interleaveInfo);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->m_priorityData);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_fileNames);
  this->m_m2tsMode = false;
  this->m_vbvLen = 45000;
  this->m_lastPESDTS = -1;
  this->m_cbrBitrate = -1;
  this->m_minBitrate = -1;
  this->m_pcrOnVideo = true;
  this->m_endStreamDTS = 0;
  this->m_prevM2TSPCROffset = 0;
  this->m_pesPID = 0;
  this->m_lastTSIndex = -1;
  this->m_lastPesLen = -1;
  this->m_lastMuxedDts = -1;
  this->m_lastPCR = -1;
  this->m_lastPMTPCR = -1;
  this->m_lastSITPCR = -1;
  this->m_nullCnt = 0;
  this->m_pmtCnt = 0;
  this->m_patCnt = 0;
  this->m_sitCnt = 0;
  this->m_needTruncate = false;
  this->m_videoTrackCnt = 0;
  this->m_DVvideoTrackCnt = 0;
  this->m_videoSecondTrackCnt = 0;
  this->m_audioTrackCnt = 0;
  this->m_secondaryAudioTrackCnt = 0;
  this->m_pgsTrackCnt = 0;
  this->m_beforePCRDataWrited = false;
  this->m_useNewStyleAudioPES = false;
  this->m_minDts = -1;
  this->m_pcrBits = 0;
  this->m_pcr_delta = -1;
  this->m_patPmtDelta = -1;
  local_38[1] = 0xffffffffffffffff;
  std::vector<long,_std::allocator<long>_>::push_back(&this->m_firstPts,local_38 + 1);
  local_38[0] = -1;
  std::vector<long,_std::allocator<long>_>::push_back(&this->m_lastPts,local_38);
  local_3c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_muxedPacketCnt,&local_3c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::emplace_back<>(&this->m_interleaveInfo);
  this->m_pesIFrame = false;
  this->m_pesSpsPps = false;
  this->m_computeMuxStats = false;
  this->m_pmtFrames = 0;
  this->m_curFileStartPts = 0;
  this->m_splitSize = 0;
  this->m_splitDuration = 0;
  this->m_curFileNum = 0;
  this->m_bluRayMode = false;
  this->m_hdmvDescriptors = true;
  this->m_lastGopNullCnt = 0;
  this->m_outBufLen = 0;
  MemoryBlock::reserve(&this->m_pesData,0x20000);
  this->m_mainStreamIndex = -1;
  this->m_muxFile = (AbstractOutputStream *)0x0;
  this->m_isExternalFile = false;
  this->m_writeBlockSize = 0;
  this->m_frameSize = 0xbc;
  this->m_processedBlockSize = 0;
  this->m_sublingMuxer = (TSMuxer *)0x0;
  this->m_outBuf = (uint8_t *)0x0;
  this->m_masterMode = false;
  this->m_subMode = false;
  setPtsOffset(this,0);
  this->m_canSwithBlock = true;
  this->m_additionCLPISize = 0;
  return;
}

Assistant:

TSMuxer::TSMuxer(MuxerManager* owner) : AbstractMuxer(owner)
{
    m_m2tsMode = false;
    m_vbvLen = DEFAULT_VBV_BUFFER_LEN * 90;
    m_lastPESDTS = -1;
    m_cbrBitrate = -1;  // mux CBR if bitrate specifed
    m_minBitrate = -1;
    m_pcrOnVideo = true;
    m_endStreamDTS = 0;
    m_prevM2TSPCROffset = 0;
    m_pesPID = 0;
    m_lastTSIndex = -1;
    m_lastPesLen = -1;
    m_lastMuxedDts = -1;
    m_lastPCR = -1;
    m_lastPMTPCR = -1;
    m_lastSITPCR = -1;
    m_nullCnt = 0;
    m_pmtCnt = 0;
    m_patCnt = 0;
    m_sitCnt = 0;
    m_needTruncate = false;
    m_videoTrackCnt = 0;
    m_DVvideoTrackCnt = 0;
    m_videoSecondTrackCnt = 0;
    m_audioTrackCnt = 0;
    m_secondaryAudioTrackCnt = 0;
    m_pgsTrackCnt = 0;
    m_beforePCRDataWrited = false;
    m_useNewStyleAudioPES = false;
    m_minDts = -1;
    m_pcrBits = 0;
    m_pcr_delta = -1;
    m_patPmtDelta = -1;
    m_firstPts.push_back(-1);
    m_lastPts.push_back(-1);
    m_muxedPacketCnt.push_back(0);
    m_interleaveInfo.emplace_back();
    m_pesIFrame = false;
    m_pesSpsPps = false;
    m_computeMuxStats = false;
    m_pmtFrames = 0;
    m_curFileStartPts = 0;  // FIXED_PTS_OFFSET;
    m_splitSize = 0;
    m_splitDuration = 0;
    m_curFileNum = 0;
    m_bluRayMode = false;
    m_hdmvDescriptors = true;
    m_lastGopNullCnt = 0;
    m_outBufLen = 0;
    m_pesData.reserve(1024 * 128);
    m_mainStreamIndex = -1;
    m_muxFile = nullptr;
    m_isExternalFile = false;
    m_writeBlockSize = 0;
    m_frameSize = 188;

    m_processedBlockSize = 0;
    m_sublingMuxer = nullptr;
    m_outBuf = nullptr;
    m_masterMode = false;
    m_subMode = false;
    setPtsOffset(0);
    m_canSwithBlock = true;
    m_additionCLPISize = 0;
#ifdef _DEBUG
    m_lastProcessedDts = -1000000000;
    m_lastStreamIndex = -1;
#endif
}